

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapSetInfo(SnapObject *snpObject,InflateMap *inflator)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (snpObject->SnapType->JsTypeId == TypeIds_Set) {
    pRVar2 = Js::JavascriptLibrary::CreateSet_TTD(this);
    return pRVar2;
  }
  pRVar2 = Js::JavascriptLibrary::CreateWeakSet_TTD(this);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapSetInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Set)
            {
                return ctx->GetLibrary()->CreateSet_TTD();
            }
            else
            {
                return ctx->GetLibrary()->CreateWeakSet_TTD();
            }
        }